

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O2

StackBackTrace *
StackBackTrace::Capture<Memory::Recycler>(Recycler *alloc,ULONG framesToSkip,ULONG framesToCapture)

{
  Recycler *alloc_00;
  StackBackTrace *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)framesToCapture << 3);
  local_48 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2696d3f;
  data.filename._0_4_ = 0x2f;
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_48);
  this = (StackBackTrace *)new<Memory::Recycler>(8,alloc_00,0x398e98,0);
  StackBackTrace(this,framesToSkip,framesToCapture);
  return this;
}

Assistant:

StackBackTrace *
StackBackTrace::Capture(TAllocator * alloc, ULONG framesToSkip, ULONG framesToCapture)
{
    return AllocatorNewPlusZ(TAllocator, alloc, sizeof(PVOID) * framesToCapture, StackBackTrace, framesToSkip, framesToCapture);
}